

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclosure.h
# Opt level: O0

void __thiscall SQGenerator::SQGenerator(SQGenerator *this,SQSharedState *ss,SQClosure *closure)

{
  SQClosure *closure_local;
  SQSharedState *ss_local;
  SQGenerator *this_local;
  
  SQCollectable::SQCollectable(&this->super_SQCollectable);
  (this->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted =
       (_func_int **)&PTR__SQGenerator_00157af8;
  ::SQObjectPtr::SQObjectPtr(&this->_closure);
  sqvector<SQObjectPtr>::sqvector(&this->_stack);
  SQVM::CallInfo::CallInfo(&this->_ci);
  sqvector<SQExceptionTrap>::sqvector(&this->_etraps);
  ::SQObjectPtr::operator=(&this->_closure,closure);
  this->_state = eRunning;
  (this->_ci)._generator = (SQGenerator *)0x0;
  (this->super_SQCollectable)._next = (SQCollectable *)0x0;
  (this->super_SQCollectable)._prev = (SQCollectable *)0x0;
  (this->super_SQCollectable)._sharedstate = ss;
  SQCollectable::AddToChain
            (&((this->super_SQCollectable)._sharedstate)->_gc_chain,(SQCollectable_conflict *)this);
  return;
}

Assistant:

SQGenerator(SQSharedState *ss,SQClosure *closure){_closure=closure;_state=eRunning;_ci._generator=NULL;INIT_CHAIN();ADD_TO_CHAIN(&_ss(this)->_gc_chain,this);}